

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O2

int __thiscall
CVmObjVector::getp_remove_range(CVmObjVector *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  
  if ((getp_remove_range(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_remove_range(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    getp_remove_range::desc.min_argc_ = 2;
    getp_remove_range::desc.opt_argc_ = 0;
    getp_remove_range::desc.varargs_ = 0;
    __cxa_guard_release(&getp_remove_range(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc(retval,argc,&getp_remove_range::desc);
  if (iVar1 != 0) {
    return 1;
  }
  uVar2 = CVmBif::pop_int_val();
  if ((int)uVar2 < 0) {
    uVar2 = uVar2 + *(ushort *)((this->super_CVmObjCollection).super_CVmObject.ext_ + 2) + 1;
  }
  if ((0 < (int)uVar2) &&
     (uVar2 <= *(ushort *)((this->super_CVmObjCollection).super_CVmObject.ext_ + 2))) {
    uVar3 = CVmBif::pop_int_val();
    if ((int)uVar3 < 0) {
      uVar3 = uVar3 + *(ushort *)((this->super_CVmObjCollection).super_CVmObject.ext_ + 2) + 1;
    }
    if (((int)uVar2 <= (int)uVar3) &&
       (uVar3 <= *(ushort *)((this->super_CVmObjCollection).super_CVmObject.ext_ + 2))) {
      retval->typ = VM_OBJ;
      (retval->val).obj = self;
      remove_elements_undo(this,self,(ulong)(uVar2 - 1),(long)(int)((uVar3 - uVar2) + 1));
      return 1;
    }
  }
  err_throw(0x7df);
}

Assistant:

int CVmObjVector::getp_remove_range(VMG_ vm_obj_id_t self,
                                    vm_val_t *retval, uint *argc)
{
    int start_idx;
    int end_idx;
    static CVmNativeCodeDesc desc(2);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the starting index; a negative value counts from the end */
    start_idx = CVmBif::pop_int_val(vmg0_);
    if (start_idx < 0)
        start_idx += get_element_count() + 1;

    /* 
     *   make sure the index is in range - it must refer to an existing
     *   element 
     */
    if (start_idx < 1 || start_idx > (int)get_element_count())
        err_throw(VMERR_INDEX_OUT_OF_RANGE);

    /* get the ending index, and adjust for negative values */
    end_idx = CVmBif::pop_int_val(vmg0_);
    if (end_idx < 0)
        end_idx += get_element_count() + 1;

    /* 
     *   make sure it's in range - it must refer to an existing element,
     *   and it must be greater than or equal to the starting index 
     */
    if (end_idx < start_idx || end_idx > (int)get_element_count())
        err_throw(VMERR_INDEX_OUT_OF_RANGE);

    /* adjust to zero-based indices */
    --start_idx;
    --end_idx;

    /* the return value is 'self' */
    retval->set_obj(self);

    /* 
     *   delete the elements - the number of elements we're deleting is
     *   one higher than the difference of the starting and ending indices
     *   (if the two indices are the same, we're deleting just the one
     *   element) 
     */
    remove_elements_undo(vmg_ self, start_idx, end_idx - start_idx + 1);

    /* handled */
    return TRUE;
}